

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfConvert.cpp
# Opt level: O2

half Imf_3_4::floatToHalf(float f)

{
  uint16_t uVar1;
  half local_a;
  
  if ((uint)ABS(f) < 0x7f800000) {
    uVar1 = 0x7c00;
    if ((*(float *)(_imath_half_to_float_table + 0x1effc) <= f &&
         f != *(float *)(_imath_half_to_float_table + 0x1effc)) ||
       (uVar1 = 0xfc00, f < *(float *)(_imath_half_to_float_table + 0x3effc))) {
      return (half)uVar1;
    }
  }
  Imath_3_2::half::half(&local_a,f);
  return (half)local_a._h;
}

Assistant:

half
floatToHalf (float f)
{
    if (isFinite (f))
    {
        if (f > std::numeric_limits<half>::max ()) return half::posInf ();

        if (f < std::numeric_limits<half>::lowest ()) return half::negInf ();
    }

    return half (f);
}